

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

string * Tools::double_to_string_abi_cxx11_(double d)

{
  _Setprecision _Var1;
  ostream *poVar2;
  string *in_RDI;
  double in_XMM0_Qa;
  ostringstream ss;
  string *s;
  ostringstream local_188 [376];
  double local_10;
  
  local_10 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
  _Var1 = std::setprecision(5);
  std::operator<<(poVar2,_Var1);
  std::ostream::operator<<(local_188,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string Tools::double_to_string(double d) {
    std::ostringstream ss;
    ss << std::fixed << std::setprecision(PRECISION);
    ss << d;
    std::string s = ss.str();
    return s;
}